

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_steal_queue.h
# Opt level: O3

circular_array * __thiscall
async::detail::work_steal_queue::circular_array::grow(circular_array *this,size_t top,size_t bottom)

{
  size_t sVar1;
  size_t sVar2;
  circular_array *pcVar3;
  void **ppvVar4;
  size_t i;
  
  pcVar3 = (circular_array *)operator_new(0x18);
  sVar1 = (this->items).length;
  (pcVar3->items).length = sVar1 * 2;
  ppvVar4 = (void **)aligned_alloc(sVar1 << 4,0x40);
  (pcVar3->items).ptr = ppvVar4;
  (pcVar3->previous)._M_t.
  super___uniq_ptr_impl<async::detail::work_steal_queue::circular_array,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
  ._M_t.
  super__Tuple_impl<0UL,_async::detail::work_steal_queue::circular_array_*,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
  .super__Head_base<0UL,_async::detail::work_steal_queue::circular_array_*,_false>._M_head_impl =
       (circular_array *)0x0;
  std::
  __uniq_ptr_impl<async::detail::work_steal_queue::circular_array,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
  ::reset((__uniq_ptr_impl<async::detail::work_steal_queue::circular_array,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
           *)&pcVar3->previous,this);
  if (top != bottom) {
    sVar1 = (this->items).length;
    sVar2 = (pcVar3->items).length;
    do {
      (pcVar3->items).ptr[sVar2 - 1 & top] = (this->items).ptr[sVar1 - 1 & top];
      top = top + 1;
    } while (bottom != top);
  }
  return pcVar3;
}

Assistant:

circular_array* grow(std::size_t top, std::size_t bottom)
		{
			circular_array* new_array = new circular_array(size() * 2);
			new_array->previous.reset(this);
			for (std::size_t i = top; i != bottom; i++)
				new_array->put(i, get(i));
			return new_array;
		}